

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_voice_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  long lVar3;
  char *in_RSI;
  long in_RDI;
  char temp [260];
  Open_JTalk *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char local_128 [272];
  char *local_18;
  long local_10;
  
  if (in_RDI == 0) {
    return false;
  }
  if ((in_RSI == (char *)0x0) ||
     (local_18 = in_RSI, local_10 = in_RDI, sVar2 = strlen(in_RSI), sVar2 == 0)) {
    return false;
  }
  clear_path_string(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
  _Var1 = is_relative((char *)temp._200_8_);
  if (_Var1) {
    if ((local_10 != -0x10c) && (sVar2 = strlen((char *)(local_10 + 0x10c)), sVar2 != 0)) {
      sVar2 = strlen((char *)(local_10 + 0x10c));
      lVar3 = sVar2 + 1;
      sVar2 = strlen(local_18);
      if (0x104 < lVar3 + sVar2 + 1) {
        return false;
      }
      strcpy(local_128,(char *)(local_10 + 0x10c));
      strcat(local_128,G_SLASH_CHAR);
      strcat(local_128,local_18);
      _Var1 = exists_file((char *)in_stack_fffffffffffffec8);
      if (_Var1) goto LAB_00196b88;
    }
  }
  else {
    strcpy(local_128,local_18);
    _Var1 = exists_file((char *)in_stack_fffffffffffffec8);
    if (_Var1) {
LAB_00196b88:
      strcpy((char *)(local_10 + 0x210),local_128);
      Open_JTalk_load_voice(in_stack_fffffffffffffec8,(char *)0x196bb6);
      return true;
    }
  }
  return false;
}

Assistant:

bool set_voice_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 相対指定の場合、
	if (is_relative(path))
	{
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			if (strlen(oj->dn_voice_dir_path) + 1 + strlen(path) + 1 > MAX_PATH)
			{
				return false;
			}

			strcpy(temp, oj->dn_voice_dir_path);
			strcat(temp, G_SLASH_CHAR);
			strcat(temp, path);

			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}

	// 絶対指定の場合、
	else
	{
		strcpy(temp, path);
		if (exists_file(temp))
		{
			goto return_true;
		}
	}

	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}